

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O3

void __thiscall amrex::AmrLevel::writePlotFile(AmrLevel *this,string *dir,ostream *os,How how)

{
  pointer pSVar1;
  pointer pcVar2;
  element_type *peVar3;
  pointer pBVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  IndexType IVar9;
  int iVar10;
  TimeCenter TVar11;
  StateDescriptor *pSVar12;
  string *psVar13;
  _List_node_base *p_Var14;
  IndexSpace *pIVar15;
  ostream *poVar16;
  DeriveRec *pDVar17;
  size_t sVar18;
  MultiFab *src;
  undefined1 verbose;
  _Alloc_hider _Var19;
  pointer pBVar20;
  _List_node_base *p_Var21;
  uint uVar22;
  int k;
  long lVar23;
  long lVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dname;
  ulong uVar25;
  pointer pbVar26;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> plot_var_map;
  string FullPath;
  string TheFullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  derive_names;
  string sLevel;
  MultiFab plotMF;
  char buf [64];
  int local_2c4;
  void *local_2b8;
  iterator iStack_2b0;
  pair<int,_int> *local_2a8;
  string *local_298;
  Real local_290;
  string local_288;
  How local_264;
  undefined1 local_260 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  long *local_218;
  long local_210;
  long local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  double adStack_1e0 [45];
  char local_78 [72];
  
  _Var19._M_p = (pointer)(ulong)how;
  local_2b8 = (void *)0x0;
  iStack_2b0._M_current = (pair<int,_int> *)0x0;
  local_2a8 = (pair<int,_int> *)0x0;
  local_298 = dir;
  local_264 = how;
  iVar7 = DescriptorList::size((DescriptorList *)desc_lst);
  if (0 < iVar7) {
    iVar7 = 0;
    do {
      pSVar12 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar7);
      iVar8 = StateDescriptor::nComp(pSVar12);
      if (0 < iVar8) {
        iVar8 = 0;
        do {
          pSVar12 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar7);
          psVar13 = StateDescriptor::name_abi_cxx11_(pSVar12,iVar8);
          bVar6 = Amr::isStatePlotVar(psVar13);
          if (bVar6) {
            pSVar12 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar7);
            IVar9 = StateDescriptor::getType(pSVar12);
            if (IVar9.itype == 0) {
              local_1f8._4_4_ = iVar8;
              local_1f8._0_4_ = iVar7;
              if (iStack_2b0._M_current == local_2a8) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           &local_2b8,iStack_2b0,(pair<int,_int> *)local_1f8);
              }
              else {
                (iStack_2b0._M_current)->first = iVar7;
                (iStack_2b0._M_current)->second = iVar8;
                iStack_2b0._M_current = iStack_2b0._M_current + 1;
              }
            }
          }
          iVar8 = iVar8 + 1;
          pSVar12 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar7);
          iVar10 = StateDescriptor::nComp(pSVar12);
        } while (iVar8 < iVar10);
      }
      iVar7 = iVar7 + 1;
      iVar8 = DescriptorList::size((DescriptorList *)desc_lst);
    } while (iVar7 < iVar8);
  }
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var14 = (_List_node_base *)DeriveList::dlist_abi_cxx11_((DeriveList *)&derive_lst);
  p_Var21 = p_Var14->_M_next;
  if (p_Var21 == p_Var14) {
    local_2c4 = 0;
  }
  else {
    local_2c4 = 0;
    do {
      pDVar17 = (DeriveRec *)(p_Var21 + 1);
      psVar13 = DeriveRec::name_abi_cxx11_(pDVar17);
      bVar6 = Amr::isDerivePlotVar(psVar13);
      if (bVar6) {
        psVar13 = DeriveRec::name_abi_cxx11_(pDVar17);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_238,psVar13);
        iVar7 = DeriveRec::numDerive(pDVar17);
        local_2c4 = local_2c4 + iVar7;
      }
      p_Var21 = (((_List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                 &p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var21 != p_Var14);
  }
  uVar25 = (long)iStack_2b0._M_current - (long)local_2b8;
  pIVar15 = EB2::TopIndexSpaceIfPresent();
  pSVar1 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar11 = StateDescriptor::timeType(pSVar1->desc);
  if (TVar11 == Point) {
    local_290 = (pSVar1->new_time).stop;
  }
  else {
    local_290 = ((pSVar1->new_time).start + (pSVar1->new_time).stop) * 0.5;
  }
  iVar7 = ((local_2c4 + 1) - (uint)(pIVar15 == (IndexSpace *)0x0)) + (int)(uVar25 >> 3);
  if ((this->level == 0) &&
     (_Var19._M_p = (pointer)&ParallelDescriptor::ioProcessor,
     *(int *)(ParallelContext::frames + 0xc) == 0)) {
    (*this->_vptr_AmrLevel[3])(local_1f8,this);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,(char *)local_1f8._0_8_,local_1f8._8_8_);
    local_78[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_78,1);
    if ((undefined1 *)local_1f8._0_8_ != local_1e8) {
      operator_delete((void *)local_1f8._0_8_,(long)local_1e8 + 1);
    }
    if (iVar7 == 0) {
      Error_host("Must specify at least one valid data item to plot");
    }
    poVar16 = (ostream *)std::ostream::operator<<(os,iVar7);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
    _Var19._M_p = (pointer)((ulong)((long)iStack_2b0._M_current - (long)local_2b8) >> 3);
    if (0 < (int)_Var19._M_p) {
      lVar23 = 0;
      do {
        iVar8 = *(int *)((long)local_2b8 + lVar23 * 8 + 4);
        pSVar12 = DescriptorList::operator[]
                            ((DescriptorList *)desc_lst,*(int *)((long)local_2b8 + lVar23 * 8));
        psVar13 = StateDescriptor::name_abi_cxx11_(pSVar12,iVar8);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (os,(psVar13->_M_dataplus)._M_p,psVar13->_M_string_length);
        local_1f8[0] = (string)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
        lVar23 = lVar23 + 1;
        _Var19._M_p = (pointer)(long)(int)((ulong)((long)iStack_2b0._M_current - (long)local_2b8) >>
                                          3);
      } while (lVar23 < (long)_Var19._M_p);
    }
    pbVar5 = local_238.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar26 = local_238.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pDVar17 = DeriveList::get((DeriveList *)&derive_lst,pbVar26);
        iVar8 = DeriveRec::numDerive(pDVar17);
        if (0 < iVar8) {
          iVar8 = 0;
          do {
            psVar13 = DeriveRec::variableName_abi_cxx11_(pDVar17,iVar8);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (os,(psVar13->_M_dataplus)._M_p,psVar13->_M_string_length);
            local_1f8[0] = (string)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
            iVar8 = iVar8 + 1;
            iVar10 = DeriveRec::numDerive(pDVar17);
          } while (iVar8 < iVar10);
        }
        pbVar26 = pbVar26 + 1;
      } while (pbVar26 != pbVar5);
    }
    pIVar15 = EB2::TopIndexSpaceIfPresent();
    if (pIVar15 != (IndexSpace *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"vfrac\n",6);
    }
    poVar16 = (ostream *)std::ostream::operator<<(os,3);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
    poVar16 = std::ostream::_M_insert<double>(this->parent->cumtime);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
    uVar22 = *(uint *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    uVar25 = (ulong)uVar22;
    poVar16 = (ostream *)std::ostream::operator<<(os,uVar22);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
    lVar23 = 0;
    do {
      poVar16 = std::ostream::_M_insert<double>((this->geom).prob_domain.xlo[lVar23]);
      local_1f8[0] = (string)0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
      lVar23 = lVar23 + 1;
    } while (lVar23 != 3);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
    lVar23 = 0;
    do {
      poVar16 = std::ostream::_M_insert<double>((this->geom).prob_domain.xhi[lVar23]);
      local_1f8[0] = (string)0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
      lVar23 = lVar23 + 1;
    } while (lVar23 != 3);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
    if (0 < (int)uVar22) {
      lVar23 = 0;
      do {
        poVar16 = (ostream *)
                  std::ostream::operator<<
                            (os,*(int *)((long)((this->parent->super_AmrCore).super_AmrMesh.
                                                super_AmrInfo.ref_ratio.
                                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                .
                                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->vect +
                                        lVar23));
        local_1f8[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
        lVar23 = lVar23 + 0xc;
      } while (uVar25 * 0xc != lVar23);
    }
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
    if (-1 < (int)uVar22) {
      lVar23 = 0;
      do {
        poVar16 = amrex::operator<<(os,(Box *)((long)(((this->parent->super_AmrCore).super_AmrMesh.
                                                       geom.
                                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  .
                                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->domain
                                                  ).smallend.vect + lVar23));
        local_1f8[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
        lVar23 = lVar23 + 200;
      } while (uVar25 * 200 + 200 != lVar23);
    }
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
    if (-1 < (int)uVar22) {
      lVar23 = 0;
      do {
        poVar16 = (ostream *)
                  std::ostream::operator<<
                            (os,(this->parent->level_steps).super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar23]);
        local_1f8[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
        lVar23 = lVar23 + 1;
      } while (uVar25 + 1 != lVar23);
    }
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
    if (-1 < (int)uVar22) {
      lVar23 = 0x20;
      uVar25 = 0;
      do {
        lVar24 = 0;
        do {
          poVar16 = std::ostream::_M_insert<double>
                              (*(double *)
                                ((long)(((this->parent->super_AmrCore).super_AmrMesh.geom.
                                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                         .
                                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys)
                                       .offset + lVar24 * 8 + lVar23 + -8));
          local_1f8[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 3);
        local_1f8[0] = (string)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
        uVar25 = uVar25 + 1;
        lVar23 = lVar23 + 200;
      } while (uVar25 != uVar22 + 1);
    }
    poVar16 = (ostream *)std::ostream::operator<<(os,(this->geom).super_CoordSys.c_sys);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"0\n",2);
  }
  if ((writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
       BaseName_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                                   ::BaseName_abi_cxx11_), iVar8 != 0)) {
    writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::BaseName_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                   BaseName_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                BaseName_abi_cxx11_,"/Cell","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                  BaseName_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                         ::BaseName_abi_cxx11_);
  }
  sprintf(local_78,"Level_%d",(ulong)(uint)this->level);
  local_218 = local_208;
  sVar18 = strlen(local_78);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,local_78,local_78 + sVar18);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  pcVar2 = (local_298->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar2,pcVar2 + local_298->_M_string_length);
  if ((local_288._M_string_length != 0) &&
     (_Var19._M_p = local_288._M_dataplus._M_p,
     local_288._M_dataplus._M_p[local_288._M_string_length - 1] != '/')) {
    std::__cxx11::string::push_back((char)&local_288);
  }
  verbose = SUB81(_Var19._M_p,0);
  std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_218);
  if (this->levelDirectoryCreated == false) {
    if ((*(int *)(ParallelContext::frames + 0xc) == 0) &&
       (bVar6 = UtilCreateDirectory((amrex *)&local_288,(string *)0x1ed,0,(bool)verbose), !bVar6)) {
      CreateDirectoryFailed(&local_288);
    }
    ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  }
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    poVar16 = (ostream *)std::ostream::operator<<(os,this->level);
    local_1f8[0] = (string)0x20;
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
    poVar16 = std::ostream::_M_insert<long>((long)poVar16);
    local_1f8[0] = (string)0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
    poVar16 = std::ostream::_M_insert<double>(local_290);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (os,(this->parent->level_steps).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[this->level]);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_1f8,1);
    peVar3 = (this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    pBVar20 = (peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start;
    pBVar4 = (peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pBVar4 != pBVar20 && -1 < (long)pBVar4 - (long)pBVar20) {
      local_298 = (string *)(this->geom).super_CoordSys.dx;
      lVar23 = 0;
      do {
        BATransformer::operator()((Box *)local_260,&(this->grids).m_bat,pBVar20 + lVar23);
        RealBox::RealBox((RealBox *)local_1f8,(Box *)local_260,(Real *)local_298,
                         (this->geom).prob_domain.xlo);
        lVar24 = 0;
        do {
          poVar16 = std::ostream::_M_insert<double>(*(double *)(local_1f8 + lVar24 * 8));
          local_260[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)local_260,1);
          poVar16 = std::ostream::_M_insert<double>(adStack_1e0[lVar24]);
          local_260[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)local_260,1);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 3);
        lVar23 = lVar23 + 1;
        peVar3 = (this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pBVar20 = (peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar24 = ((long)(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pBVar20 >> 2) * 0x6db6db6db6db6db7
        ;
      } while (lVar24 - lVar23 != 0 && lVar23 <= lVar24);
    }
    if (0 < iVar7) {
      local_1f8._0_8_ = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,local_218,local_210 + (long)local_218);
      std::__cxx11::string::_M_append
                (local_1f8,
                 (ulong)writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                        BaseName_abi_cxx11_._M_dataplus._M_p);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (os,(char *)local_1f8._0_8_,local_1f8._8_8_);
      local_260[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_260,1);
      if ((undefined1 *)local_1f8._0_8_ != local_1e8) {
        operator_delete((void *)local_1f8._0_8_,(long)local_1e8 + 1);
      }
    }
    pIVar15 = EB2::TopIndexSpaceIfPresent();
    if ((pIVar15 != (IndexSpace *)0x0) &&
       (-1 < this->level &&
        this->level == *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c
       )) {
      iVar8 = -1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"1.0e-6\n",7);
        iVar8 = iVar8 + 1;
      } while (iVar8 < *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c
              );
    }
  }
  local_260._0_8_ = (pointer)0x1;
  local_260._8_8_ = (Arena *)0x0;
  vStack_250.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_250.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_250.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar25 = 0;
  MultiFab::MultiFab((MultiFab *)local_1f8,&this->grids,&this->dmap,iVar7,0,(MFInfo *)local_260,
                     (this->m_factory)._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_250);
  if (0 < (int)((ulong)((long)iStack_2b0._M_current - (long)local_2b8) >> 3)) {
    uVar25 = 0;
    do {
      MultiFab::Copy((MultiFab *)local_1f8,
                     (MultiFab *)
                     (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                     .super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)local_2b8 + uVar25 * 8)].new_data._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                     *(int *)((long)local_2b8 + uVar25 * 8 + 4),(int)uVar25,1,0);
      uVar25 = uVar25 + 1;
    } while ((long)uVar25 < (long)(int)((ulong)((long)iStack_2b0._M_current - (long)local_2b8) >> 3)
            );
  }
  pbVar5 = local_238.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar22 = (uint)uVar25;
  if (local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pbVar26 = local_238.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      (*this->_vptr_AmrLevel[0x20])(local_290,this,pbVar26,local_1f8,uVar25 & 0xffffffff);
      pDVar17 = DeriveList::get((DeriveList *)&derive_lst,pbVar26);
      iVar7 = DeriveRec::numDerive(pDVar17);
      uVar22 = (int)uVar25 + iVar7;
      uVar25 = (ulong)uVar22;
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 != pbVar5);
  }
  pIVar15 = EB2::TopIndexSpaceIfPresent();
  if (pIVar15 != (IndexSpace *)0x0) {
    local_260._0_8_ = (pointer)0x0;
    local_260._8_8_ = local_260._8_8_ & 0xffffffff00000000;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)local_1f8,0.0,uVar22,1,(IntVect *)local_260);
    src = EBDataCollection::getVolFrac
                    ((EBDataCollection *)
                     (this->m_factory)._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl[0x1b]._vptr_FabFactory);
    MultiFab::Copy((MultiFab *)local_1f8,src,0,uVar22,1,0);
  }
  local_260._0_8_ = &vStack_250;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_260,local_288._M_dataplus._M_p,
             local_288._M_dataplus._M_p + local_288._M_string_length);
  std::__cxx11::string::_M_append
            (local_260,
             (ulong)writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                    BaseName_abi_cxx11_._M_dataplus._M_p);
  bVar6 = AsyncOut::UseAsyncOut();
  if (bVar6) {
    VisMF::AsyncWrite((FabArray<amrex::FArrayBox> *)local_1f8,(string *)local_260,false);
  }
  else {
    VisMF::Write((FabArray<amrex::FArrayBox> *)local_1f8,(string *)local_260,local_264,true);
  }
  this->levelDirectoryCreated = false;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_260._0_8_ != &vStack_250) {
    operator_delete((void *)local_260._0_8_,
                    (ulong)((long)vStack_250.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  MultiFab::~MultiFab((MultiFab *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  if (local_2b8 != (void *)0x0) {
    operator_delete(local_2b8,(long)local_2a8 - (long)local_2b8);
  }
  return;
}

Assistant:

void
AmrLevel::writePlotFile (const std::string& dir,
                         std::ostream&      os,
                         VisMF::How         how)
{
    int i, n;
    //
    // The list of indices of State to write to plotfile.
    // first component of pair is state_type,
    // second component of pair is component # within the state_type
    //
    std::vector<std::pair<int,int> > plot_var_map;
    for (int typ = 0; typ < desc_lst.size(); typ++)
    {
        for (int comp = 0; comp < desc_lst[typ].nComp();comp++)
        {
            if (parent->isStatePlotVar(desc_lst[typ].name(comp)) &&
                desc_lst[typ].getType() == IndexType::TheCellType())
            {
                plot_var_map.push_back(std::pair<int,int>(typ,comp));
            }
        }
    }

    int num_derive = 0;
    std::vector<std::string> derive_names;
    const std::list<DeriveRec>& dlist = derive_lst.dlist();
    for (auto const& d : dlist)
    {
        if (parent->isDerivePlotVar(d.name()))
        {
            derive_names.push_back(d.name());
            num_derive += d.numDerive();
        }
    }

    int n_data_items = plot_var_map.size() + num_derive;

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        n_data_items += 1;
    }
#endif

    // get the time from the first State_Type
    // if the State_Type is ::Interval, this will get t^{n+1/2} instead of t^n
    Real cur_time = state[0].curTime();

    if (level == 0 && ParallelDescriptor::IOProcessor())
    {
        //
        // The first thing we write out is the plotfile type.
        //
        os << thePlotFileType() << '\n';

        if (n_data_items == 0)
            amrex::Error("Must specify at least one valid data item to plot");

        os << n_data_items << '\n';

        //
        // Names of variables
        //
        for (i =0; i < static_cast<int>(plot_var_map.size()); i++)
        {
            int typ = plot_var_map[i].first;
            int comp = plot_var_map[i].second;
            os << desc_lst[typ].name(comp) << '\n';
        }

        // derived
        for (auto const& dname : derive_names) {
            const DeriveRec* rec = derive_lst.get(dname);
            for (i = 0; i < rec->numDerive(); ++i) {
                os << rec->variableName(i) << '\n';
            }
        }

#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            os << "vfrac\n";
        }
#endif

        os << AMREX_SPACEDIM << '\n';
        os << parent->cumTime() << '\n';
        int f_lev = parent->finestLevel();
        os << f_lev << '\n';
        for (i = 0; i < AMREX_SPACEDIM; i++)
            os << Geom().ProbLo(i) << ' ';
        os << '\n';
        for (i = 0; i < AMREX_SPACEDIM; i++)
            os << Geom().ProbHi(i) << ' ';
        os << '\n';
        for (i = 0; i < f_lev; i++)
            os << parent->refRatio(i)[0] << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
            os << parent->Geom(i).Domain() << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
            os << parent->levelSteps(i) << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
        {
            for (int k = 0; k < AMREX_SPACEDIM; k++)
                os << parent->Geom(i).CellSize()[k] << ' ';
            os << '\n';
        }
        os << (int) Geom().Coord() << '\n';
        os << "0\n"; // Write bndry data.

    }
    // Build the directory to hold the MultiFab at this level.
    // The name is relative to the directory containing the Header file.
    //
    static const std::string BaseName = "/Cell";
    char buf[64];
    sprintf(buf, "Level_%d", level);
    std::string sLevel = buf;
    //
    // Now for the full pathname of that directory.
    //
    std::string FullPath = dir;
    if ( ! FullPath.empty() && FullPath[FullPath.size()-1] != '/')
    {
        FullPath += '/';
    }
    FullPath += sLevel;
    //
    // Only the I/O processor makes the directory if it doesn't already exist.
    //
    if ( ! levelDirectoryCreated) {
        if (ParallelDescriptor::IOProcessor()) {
            if ( ! amrex::UtilCreateDirectory(FullPath, 0755)) {
                amrex::CreateDirectoryFailed(FullPath);
            }
        }
        // Force other processors to wait until directory is built.
        ParallelDescriptor::Barrier();
    }

    if (ParallelDescriptor::IOProcessor())
    {
        os << level << ' ' << grids.size() << ' ' << cur_time << '\n';
        os << parent->levelSteps(level) << '\n';

        for (i = 0; i < grids.size(); ++i)
        {
            RealBox gridloc = RealBox(grids[i],geom.CellSize(),geom.ProbLo());
            for (n = 0; n < AMREX_SPACEDIM; n++)
                os << gridloc.lo(n) << ' ' << gridloc.hi(n) << '\n';
        }
        //
        // The full relative pathname of the MultiFabs at this level.
        // The name is relative to the Header file containing this name.
        // It's the name that gets written into the Header.
        //
        if (n_data_items > 0)
        {
            std::string PathNameInHeader = sLevel;
            PathNameInHeader += BaseName;
            os << PathNameInHeader << '\n';
        }

#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            // volfrac threshold for amrvis
            if (level == parent->finestLevel()) {
                for (int lev = 0; lev <= parent->finestLevel(); ++lev) {
                    os << "1.0e-6\n";
                }
            }
        }
#endif
    }
    //
    // We combine all of the multifabs -- state, derived, etc -- into one
    // multifab -- plotMF.
    int       cnt   = 0;
    const int nGrow = 0;
    MultiFab  plotMF(grids,dmap,n_data_items,nGrow,MFInfo(),Factory());
    MultiFab* this_dat = 0;
    //
    // Cull data from state variables -- use no ghost cells.
    //
    for (i = 0; i < static_cast<int>(plot_var_map.size()); i++)
    {
        int typ  = plot_var_map[i].first;
        int comp = plot_var_map[i].second;
        this_dat = &state[typ].newData();
        MultiFab::Copy(plotMF,*this_dat,comp,cnt,1,nGrow);
        cnt++;
    }

    // derived
    if (derive_names.size() > 0)
    {
        for (auto const& dname : derive_names)
        {
            derive(dname, cur_time, plotMF, cnt);
            cnt += derive_lst.get(dname)->numDerive();
        }
    }

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        plotMF.setVal(0.0, cnt, 1, nGrow);
        auto factory = static_cast<EBFArrayBoxFactory*>(m_factory.get());
        MultiFab::Copy(plotMF,factory->getVolFrac(),0,cnt,1,nGrow);
    }
#endif

    //
    // Use the Full pathname when naming the MultiFab.
    //
    std::string TheFullPath = FullPath;
    TheFullPath += BaseName;
    if (AsyncOut::UseAsyncOut()) {
        VisMF::AsyncWrite(plotMF,TheFullPath);
    } else {
        VisMF::Write(plotMF,TheFullPath,how,true);
    }

    levelDirectoryCreated = false;  // ---- now that the plotfile is finished
}